

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O3

void __thiscall ThreadedTest::RunThreads(ThreadedTest *this)

{
  pointer ptVar1;
  thread *thread;
  pointer ptVar2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_5c;
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  ThreadedTest *local_40;
  offset_in_ThreadedTest_to_subr local_38 [2];
  
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = 0;
  if (0 < this->num_threads_) {
    do {
      local_38[0] = 0x31;
      local_38[1] = 0;
      local_40 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(ThreadedTest::*)(int),ThreadedTest*,int&>
                ((vector<std::thread,std::allocator<std::thread>> *)&local_58,local_38,&local_40,
                 &local_5c);
      ptVar1 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_5c = local_5c + 1;
      ptVar2 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_5c < this->num_threads_);
    for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      float value = bit_cast<float>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint32_t me;
      ASSERT_EQ(Result::Ok,
                ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }